

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

void __thiscall scp::Tensor<double>::Tensor(Tensor<double> *this,uint64_t order,uint64_t *sizes)

{
  uint64_t uVar1;
  int iVar2;
  uint64_t *puVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  long lVar6;
  ulong uVar7;
  
  this->_vptr_Tensor = (_func_int **)&PTR__Tensor_00110c80;
  (this->_shape).order = order;
  puVar3 = (uint64_t *)operator_new__(-(ulong)(order >> 0x3d != 0) | order * 8);
  (this->_shape).sizes = puVar3;
  iVar2 = 1;
  for (lVar6 = 0; order * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
    iVar2 = iVar2 * *(int *)((long)sizes + lVar6);
  }
  this->_length = (long)iVar2;
  uVar7 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar7 = (long)iVar2 << 3;
  }
  pdVar4 = (double *)operator_new__(uVar7);
  this->_values = pdVar4;
  this->_owner = true;
  if (order != 0) {
    puVar5 = std::__find_if<unsigned_long_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (sizes,sizes + order);
    if (puVar5 == sizes + order) {
      uVar1 = (this->_shape).order;
      if (uVar1 != 0) {
        memmove((this->_shape).sizes,sizes,uVar1 << 3);
      }
      return;
    }
    __assert_fail("std::find(sizes, sizes + order, 0) == sizes + order",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                  ,0x9c,"scp::Tensor<double>::Tensor(uint64_t, const uint64_t *) [TValue = double]")
    ;
  }
  __assert_fail("order != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                ,0x9b,"scp::Tensor<double>::Tensor(uint64_t, const uint64_t *) [TValue = double]");
}

Assistant:

constexpr Tensor<TValue>::Tensor(uint64_t order, const uint64_t* sizes) :
		_shape{ order, new uint64_t[order] },
		_length(std::accumulate(sizes, sizes + order, 1, std::multiplies<uint64_t>())),
		_values(new TValue[_length]),
		_owner(true)
	{
		assert(order != 0);
		assert(std::find(sizes, sizes + order, 0) == sizes + order);

		std::copy_n(sizes, _shape.order, _shape.sizes);
	}